

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O2

void Fra_FraigVerifyCounterEx(Fra_Man_t *p,Vec_Int_t *vCex)

{
  undefined1 *puVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  Aig_Man_t *pAVar3;
  Fra_Cla_t *pFVar4;
  long *plVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  long lVar9;
  
  pAVar3 = p->pManAig;
  if (pAVar3->nObjs[2] != vCex->nSize) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCore.c"
                  ,0xbe,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
  }
  iVar7 = 0;
  while( true ) {
    if (pAVar3->vObjs->nSize <= iVar7) {
      puVar1 = &pAVar3->pConst1->field_0x18;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
      lVar9 = 0;
      while( true ) {
        pAVar3 = p->pManAig;
        if (pAVar3->vCis->nSize <= lVar9) {
          for (iVar7 = 0; iVar7 < pAVar3->vObjs->nSize; iVar7 = iVar7 + 1) {
            pvVar2 = Vec_PtrEntry(pAVar3->vObjs,iVar7);
            if ((pvVar2 != (void *)0x0) &&
               (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
              *(ulong *)((long)pvVar2 + 0x18) =
                   *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
                   (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                            *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18)
                            >> 5) & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                                    *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                             0x18) >> 5) & 1) << 5);
            }
            pAVar3 = p->pManAig;
          }
          for (iVar7 = 0; iVar7 < pAVar3->vCos->nSize; iVar7 = iVar7 + 1) {
            pvVar2 = Vec_PtrEntry(pAVar3->vCos,iVar7);
            *(ulong *)((long)pvVar2 + 0x18) =
                 *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
                 (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                         *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) &
                        0x20);
            pAVar3 = p->pManAig;
          }
          iVar7 = 0;
          while( true ) {
            pFVar4 = p->pCla;
            if (pFVar4->vClasses1->nSize <= iVar7) break;
            pvVar2 = Vec_PtrEntry(pFVar4->vClasses1,iVar7);
            if (((*(uint *)((long)pvVar2 + 0x18) >> 5 ^ *(uint *)((long)pvVar2 + 0x18) >> 3) & 1) !=
                0) {
              printf("The node %d is not constant under cex!\n",
                     (ulong)*(uint *)((long)pvVar2 + 0x24));
            }
            iVar7 = iVar7 + 1;
          }
          for (iVar7 = 0; iVar7 < pFVar4->vClasses->nSize; iVar7 = iVar7 + 1) {
            plVar5 = (long *)Vec_PtrEntry(pFVar4->vClasses,iVar7);
            plVar8 = plVar5;
            while( true ) {
              plVar8 = plVar8 + 1;
              lVar9 = *plVar8;
              if (lVar9 == 0) break;
              uVar6 = *(uint *)(lVar9 + 0x18) ^ *(uint *)(*plVar5 + 0x18);
              if (((uVar6 >> 5 ^ uVar6 >> 3) & 1) != 0) {
                printf("The nodes %d and %d are not equal under cex!\n",
                       (ulong)*(uint *)(*plVar5 + 0x24),(ulong)*(uint *)(lVar9 + 0x24));
              }
            }
            pFVar4 = p->pCla;
          }
          for (iVar7 = 0; p_00 = p->pManAig->vObjs, iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
            pvVar2 = Vec_PtrEntry(p_00,iVar7);
            if (pvVar2 != (void *)0x0) {
              *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) & 0xdf;
            }
          }
          return;
        }
        pvVar2 = Vec_PtrEntry(pAVar3->vCis,(int)lVar9);
        if (vCex->nSize <= lVar9) break;
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)((vCex->pArray[lVar9] & 1U) << 5);
        lVar9 = lVar9 + 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pvVar2 = Vec_PtrEntry(pAVar3->vObjs,iVar7);
    if ((pvVar2 != (void *)0x0) && ((*(byte *)((long)pvVar2 + 0x18) & 0x20) != 0)) break;
    iVar7 = iVar7 + 1;
    pAVar3 = p->pManAig;
  }
  __assert_fail("!pObj->fMarkB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCore.c"
                ,0xc1,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
}

Assistant:

void Fra_FraigVerifyCounterEx( Fra_Man_t * p, Vec_Int_t * vCex )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c;
    assert( Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex) );
    // make sure the input pattern is not used
    Aig_ManForEachObj( p->pManAig, pObj, i )
        assert( !pObj->fMarkB );
    // simulate the cex through the AIG
    Aig_ManConst1(p->pManAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pObj->fMarkB = Vec_IntEntry(vCex, i);
    Aig_ManForEachNode( p->pManAig, pObj, i )
        pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                       (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( p->pManAig, pObj, i )
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
    // check if the classes hold
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        if ( pObj->fPhase != pObj->fMarkB )
            printf( "The node %d is not constant under cex!\n", pObj->Id );
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 1; ppClass[c]; c++ )
            if ( (ppClass[0]->fPhase ^ ppClass[c]->fPhase) != (ppClass[0]->fMarkB ^ ppClass[c]->fMarkB) )
                printf( "The nodes %d and %d are not equal under cex!\n", ppClass[0]->Id, ppClass[c]->Id );
//        for ( c = 0; ppClass[c]; c++ )
//            if ( Fra_ObjFraig(ppClass[c],p->pPars->nFramesK) == Aig_ManConst1(p->pManFraig) )
//                printf( "A member of non-constant class has a constant repr!\n" );
    }
    // clean the simulation pattern
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->fMarkB = 0;
}